

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_sse2.h
# Opt level: O0

void VP8Transpose_2_4x4_16b
               (__m128i *in0,__m128i *in1,__m128i *in2,__m128i *in3,__m128i *out0,__m128i *out1,
               __m128i *out2,__m128i *out3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined2 *in_R8;
  undefined2 *in_R9;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  __m128i transpose1_3;
  __m128i transpose1_2;
  __m128i transpose1_1;
  __m128i transpose1_0;
  __m128i transpose0_3;
  __m128i transpose0_2;
  __m128i transpose0_1;
  __m128i transpose0_0;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_118 = (undefined2)uVar1;
  uStack_116 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_114 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_112 = (undefined2)((ulong)uVar1 >> 0x30);
  local_128 = (undefined2)uVar2;
  uStack_126 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_124 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_122 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *in_RDX;
  uVar2 = *in_RCX;
  local_138 = (undefined2)uVar1;
  uStack_136 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_134 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_132 = (undefined2)((ulong)uVar1 >> 0x30);
  local_148 = (undefined2)uVar2;
  uStack_146 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_144 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_142 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[1];
  uVar2 = in_RSI[1];
  uStack_d0 = (undefined2)uVar1;
  uStack_ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_e0 = (undefined2)uVar2;
  uStack_de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_da = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDX[1];
  uVar2 = in_RCX[1];
  uStack_f0 = (undefined2)uVar1;
  uStack_ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_100 = (undefined2)uVar2;
  uStack_fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_fa = (undefined2)((ulong)uVar2 >> 0x30);
  *in_R8 = local_118;
  in_R8[1] = local_128;
  in_R8[2] = local_138;
  in_R8[3] = local_148;
  in_R8[4] = uStack_d0;
  in_R8[5] = uStack_e0;
  in_R8[6] = uStack_f0;
  in_R8[7] = uStack_100;
  *in_R9 = uStack_116;
  in_R9[1] = uStack_126;
  in_R9[2] = uStack_136;
  in_R9[3] = uStack_146;
  in_R9[4] = uStack_ce;
  in_R9[5] = uStack_de;
  in_R9[6] = uStack_ee;
  in_R9[7] = uStack_fe;
  *(undefined2 *)*out0 = uStack_114;
  *(undefined2 *)((long)*out0 + 2) = uStack_124;
  *(undefined2 *)((long)*out0 + 4) = uStack_134;
  *(undefined2 *)((long)*out0 + 6) = uStack_144;
  *(undefined2 *)(*out0 + 1) = uStack_cc;
  *(undefined2 *)((long)*out0 + 10) = uStack_dc;
  *(undefined2 *)((long)*out0 + 0xc) = uStack_ec;
  *(undefined2 *)((long)*out0 + 0xe) = uStack_fc;
  *(undefined2 *)*in3 = uStack_112;
  *(undefined2 *)((long)*in3 + 2) = uStack_122;
  *(undefined2 *)((long)*in3 + 4) = uStack_132;
  *(undefined2 *)((long)*in3 + 6) = uStack_142;
  *(undefined2 *)(*in3 + 1) = uStack_ca;
  *(undefined2 *)((long)*in3 + 10) = uStack_da;
  *(undefined2 *)((long)*in3 + 0xc) = uStack_ea;
  *(undefined2 *)((long)*in3 + 0xe) = uStack_fa;
  return;
}

Assistant:

static WEBP_INLINE void VP8Transpose_2_4x4_16b(
    const __m128i* const in0, const __m128i* const in1,
    const __m128i* const in2, const __m128i* const in3, __m128i* const out0,
    __m128i* const out1, __m128i* const out2, __m128i* const out3) {
  // Transpose the two 4x4.
  // a00 a01 a02 a03   b00 b01 b02 b03
  // a10 a11 a12 a13   b10 b11 b12 b13
  // a20 a21 a22 a23   b20 b21 b22 b23
  // a30 a31 a32 a33   b30 b31 b32 b33
  const __m128i transpose0_0 = _mm_unpacklo_epi16(*in0, *in1);
  const __m128i transpose0_1 = _mm_unpacklo_epi16(*in2, *in3);
  const __m128i transpose0_2 = _mm_unpackhi_epi16(*in0, *in1);
  const __m128i transpose0_3 = _mm_unpackhi_epi16(*in2, *in3);
  // a00 a10 a01 a11   a02 a12 a03 a13
  // a20 a30 a21 a31   a22 a32 a23 a33
  // b00 b10 b01 b11   b02 b12 b03 b13
  // b20 b30 b21 b31   b22 b32 b23 b33
  const __m128i transpose1_0 = _mm_unpacklo_epi32(transpose0_0, transpose0_1);
  const __m128i transpose1_1 = _mm_unpacklo_epi32(transpose0_2, transpose0_3);
  const __m128i transpose1_2 = _mm_unpackhi_epi32(transpose0_0, transpose0_1);
  const __m128i transpose1_3 = _mm_unpackhi_epi32(transpose0_2, transpose0_3);
  // a00 a10 a20 a30 a01 a11 a21 a31
  // b00 b10 b20 b30 b01 b11 b21 b31
  // a02 a12 a22 a32 a03 a13 a23 a33
  // b02 b12 a22 b32 b03 b13 b23 b33
  *out0 = _mm_unpacklo_epi64(transpose1_0, transpose1_1);
  *out1 = _mm_unpackhi_epi64(transpose1_0, transpose1_1);
  *out2 = _mm_unpacklo_epi64(transpose1_2, transpose1_3);
  *out3 = _mm_unpackhi_epi64(transpose1_2, transpose1_3);
  // a00 a10 a20 a30   b00 b10 b20 b30
  // a01 a11 a21 a31   b01 b11 b21 b31
  // a02 a12 a22 a32   b02 b12 b22 b32
  // a03 a13 a23 a33   b03 b13 b23 b33
}